

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::DatabaseInterface::Impl::parse_imported_metadata(Impl *this,void *data_,size_t size_)

{
  Impl *pIVar1;
  ulong uVar2;
  ulong uVar3;
  ExportedMetadataHeader *pEVar4;
  ExportedMetadataHeader *pEVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  headers;
  ExportedMetadataHeader *header;
  void *local_68;
  iterator iStack_60;
  ExportedMetadataHeader **local_58;
  ExportedMetadataHeader *local_48;
  ExportedMetadataHeader *local_40;
  Impl *local_38;
  
  local_68 = (void *)0x0;
  iStack_60._M_current = (ExportedMetadataHeader **)0x0;
  local_58 = (ExportedMetadataHeader **)0x0;
  uVar3 = 0;
  do {
    if (size_ < uVar3 + 0xb0) break;
    uVar2 = *(long *)((long)data_ + uVar3 + 8) + uVar3;
    if ((size_ < uVar2) ||
       ((*(long *)((long)data_ + uVar3) != 0xb10b5f05511153 &&
        (*(long *)((long)data_ + uVar3) != 0xb10bf05511153)))) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
      uVar3 = uVar2;
    }
  } while (bVar6);
  if (0xaf < uVar3) {
    local_38 = this;
    if (*data_ == 0xb10b5f05511153) {
      uVar3 = uVar3 - *(long *)((long)data_ + 8);
      pEVar4 = (ExportedMetadataHeader *)((long)data_ + *(long *)((long)data_ + 8));
      local_48 = (ExportedMetadataHeader *)data_;
    }
    else {
      local_48 = (ExportedMetadataHeader *)0x0;
      pEVar4 = (ExportedMetadataHeader *)data_;
    }
    do {
      pIVar1 = local_38;
      if (uVar3 == 0) {
        if (local_38->mapped_metadata != (uint8_t *)0x0) {
          munmap(local_38->mapped_metadata,local_38->mapped_metadata_size);
        }
        pIVar1->mapped_metadata = (uint8_t *)data_;
        pIVar1->mapped_metadata_size = size_;
        std::
        vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ::_M_move_assign(&pIVar1->imported_metadata,&local_68);
        pIVar1->imported_concurrent_metadata = local_48;
        bVar6 = true;
        goto LAB_0010ff5e;
      }
      if (uVar3 < 0xb0) break;
      local_40 = pEVar4;
      if (pEVar4->magic == 0xb10bf05511153) {
        uVar2 = pEVar4->size;
        uVar8 = uVar3 - uVar2;
        if (uVar3 < uVar2) goto LAB_0010ffdc;
        lVar7 = 0x18;
        do {
          if (uVar3 < (ulong)(*(long *)((long)&((ExportedMetadataHeader *)(pEVar4->lists + -1))->
                                               magic + lVar7) * 0x20 +
                             *(long *)((long)pEVar4->lists + lVar7 + -0x18))) goto LAB_0010ffdc;
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0xb8);
        pEVar5 = (ExportedMetadataHeader *)
                 ((long)&((ExportedMetadataHeader *)(pEVar4->lists + -1))->magic + uVar2);
        if (iStack_60._M_current == local_58) {
          std::
          vector<Fossilize::ExportedMetadataHeader_const*,std::allocator<Fossilize::ExportedMetadataHeader_const*>>
          ::_M_realloc_insert<Fossilize::ExportedMetadataHeader_const*const&>
                    ((vector<Fossilize::ExportedMetadataHeader_const*,std::allocator<Fossilize::ExportedMetadataHeader_const*>>
                      *)&local_68,iStack_60,&local_40);
        }
        else {
          *iStack_60._M_current = pEVar4;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        bVar6 = true;
      }
      else {
LAB_0010ffdc:
        bVar6 = false;
        uVar8 = uVar3;
        pEVar5 = pEVar4;
      }
      uVar3 = uVar8;
      pEVar4 = pEVar5;
    } while (bVar6);
  }
  bVar6 = false;
LAB_0010ff5e:
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return bVar6;
}

Assistant:

bool DatabaseInterface::Impl::parse_imported_metadata(const void *data_, size_t size_)
{
	std::vector<const ExportedMetadataHeader *> headers;
	auto *data = static_cast<const uint8_t *>(data_);

	// Imported size might be rounded up to page size, so find exact bound first.
	size_t size = deduce_imported_size(data_, size_);

	if (size < sizeof(ExportedMetadataHeader))
		return false;

	auto *concurrent_header = reinterpret_cast<const ExportedMetadataHeader *>(data);
	if (concurrent_header->magic == ExportedMetadataMagicConcurrent)
	{
		data += concurrent_header->size;
		size -= concurrent_header->size;
	}
	else
		concurrent_header = nullptr;

	while (size != 0)
	{
		if (size < sizeof(ExportedMetadataHeader))
			return false;

		auto *header = reinterpret_cast<const ExportedMetadataHeader *>(data);
		if (header->magic != ExportedMetadataMagic)
			return false;
		if (header->size > size)
			return false;

		for (auto &list : header->lists)
			if (list.offset + list.count * sizeof(ExportedMetadataBlock) > size)
				return false;

		data += header->size;
		size -= header->size;
		headers.push_back(header);
	}

#ifdef _WIN32
	if (mapped_metadata)
		UnmapViewOfFile(mapped_metadata);
#else
	if (mapped_metadata)
		munmap(const_cast<uint8_t *>(mapped_metadata), mapped_metadata_size);
#endif
	mapped_metadata = static_cast<const uint8_t *>(data_);
	mapped_metadata_size = size_;
	imported_metadata = std::move(headers);
	imported_concurrent_metadata = concurrent_header;
	return true;
}